

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

bool __thiscall Tester::testFile(Tester *this,string *filename)

{
  bool bVar1;
  error_category *peVar2;
  Message *m;
  pointer pMVar3;
  error_code eVar4;
  allocator<char> local_4e1;
  BufferedReport expected;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_4c0;
  size_type local_4b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b0;
  string local_4a0;
  BufferedReport actual;
  string local_460;
  stringstream sstr;
  ostream local_430 [376];
  Parser p;
  DifferenceReport diff;
  
  actual.super_Report._vptr_Report = (_func_int **)&PTR__BufferedReport_001af258;
  actual.messages_.
  super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  actual.messages_.
  super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  actual.messages_.
  super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  compileFile(this,filename,&actual.super_Report);
  expected.super_Report._vptr_Report = (_func_int **)&PTR__BufferedReport_001af258;
  expected.messages_.
  super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  expected.messages_.
  super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  expected.messages_.
  super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_460,(string *)filename);
  std::ifstream::ifstream(&diff,(string *)filename,_S_in);
  std::__cxx11::stringstream::stringstream((stringstream *)&sstr);
  std::ostream::operator<<
            (local_430,
             (streambuf *)
             &diff.first.
              super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::stringbuf::str();
  local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
  if (local_4c0 == &local_4b0) {
    local_4a0.field_2._8_8_ = local_4b0._8_8_;
  }
  else {
    local_4a0._M_dataplus._M_p = (pointer)local_4c0;
  }
  local_4a0._M_string_length = local_4b8;
  local_4b8 = 0;
  local_4b0._M_local_buf[0] = '\0';
  local_4c0 = &local_4b0;
  std::__cxx11::string::~string((string *)&local_4c0);
  std::__cxx11::stringstream::~stringstream((stringstream *)&sstr);
  std::ifstream::~ifstream(&diff);
  flowtest::Parser::Parser(&p,&local_460,&local_4a0);
  std::__cxx11::string::~string((string *)&local_4a0);
  std::__cxx11::string::~string((string *)&local_460);
  eVar4 = flowtest::Parser::parse(&p,&expected.super_Report);
  peVar2 = eVar4._M_cat;
  if (eVar4._M_value == 0) {
    flow::diagnostics::difference(&diff,&actual,&expected);
    for (pMVar3 = diff.first.
                  super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pMVar3 != diff.first.
                  super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pMVar3 = pMVar3 + 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sstr,"Missing: {}",(allocator<char> *)&local_4c0);
      reportError<flow::diagnostics::Message_const&>(this,(string *)&sstr,pMVar3);
      std::__cxx11::string::~string((string *)&sstr);
    }
    for (pMVar3 = diff.second.
                  super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pMVar3 != diff.second.
                  super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pMVar3 = pMVar3 + 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sstr,"Superfluous: {}",(allocator<char> *)&local_4c0);
      reportError<flow::diagnostics::Message_const&>(this,(string *)&sstr,pMVar3);
      std::__cxx11::string::~string((string *)&sstr);
    }
    bVar1 = flow::diagnostics::BufferedReport::operator!=(&actual,&expected);
    bVar1 = !bVar1;
    std::
    pair<std::vector<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>,_std::vector<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>_>
    ::~pair(&diff);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&diff,"Parse Error({}): {}",&local_4e1);
    local_4c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(**(code **)(*(long *)peVar2 + 0x10))(peVar2);
    (**(code **)(*(long *)peVar2 + 0x20))(&sstr,peVar2,eVar4._M_value);
    reportError<char_const*,std::__cxx11::string>
              (this,(string *)&diff,(char **)&local_4c0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sstr);
    std::__cxx11::string::~string((string *)&sstr);
    std::__cxx11::string::~string((string *)&diff);
    bVar1 = false;
  }
  flowtest::Lexer::~Lexer(&p.lexer_);
  flow::diagnostics::BufferedReport::~BufferedReport(&expected);
  flow::diagnostics::BufferedReport::~BufferedReport(&actual);
  return bVar1;
}

Assistant:

bool Tester::testFile(const std::string& filename) {
  flow::diagnostics::BufferedReport actual;
  compileFile(filename, &actual);

  flow::diagnostics::BufferedReport expected;
  Parser p(filename, readFile(filename));
  std::error_code ec = p.parse(&expected);
  if (ec) {
    reportError("Parse Error({}): {}", ec.category().name(), ec.message());
    return false;
  }

  flow::diagnostics::DifferenceReport diff = flow::diagnostics::difference(actual, expected);
  for (const Message& m : diff.first)
    reportError("Missing: {}", m);
  for (const Message& m : diff.second)
    reportError("Superfluous: {}", m);

  if (actual != expected)
    return false;

  return true;
}